

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

int __thiscall
CVmObject::getp_propinh
          (CVmObject *this,vm_obj_id_t self,vm_val_t *retval,uint *in_argc,vm_prop_id_t param_5,
          vm_obj_id_t *param_6)

{
  int iVar1;
  int iVar2;
  uint *in_RCX;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  long *in_RDI;
  vm_obj_id_t defining_obj;
  vm_obj_id_t orig_target_obj;
  vm_obj_id_t source_obj;
  vm_prop_id_t prop;
  int found;
  int flags;
  vm_val_t val;
  uint argc;
  vm_val_t *in_stack_ffffffffffffff58;
  CVmRun *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  uint local_84;
  vm_obj_id_t local_60;
  undefined2 local_5a;
  int local_58;
  int local_54;
  undefined1 local_50 [8];
  int local_48;
  uint local_3c;
  vm_val_t *local_20;
  vm_obj_id_t local_14;
  
  if (in_RCX == (uint *)0x0) {
    local_84 = 0;
  }
  else {
    local_84 = *in_RCX;
  }
  local_3c = local_84;
  local_20 = in_RDX;
  local_14 = in_ESI;
  if ((getp_propinh(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)::desc == '\0'
      ) && (iVar2 = __cxa_guard_acquire(&getp_propinh(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)
                                         ::desc), iVar2 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_propinh::desc,3,1);
    __cxa_guard_release(&getp_propinh(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)
                         ::desc);
  }
  iVar2 = get_prop_check_argc((vm_val_t *)
                              CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                              (uint *)in_stack_ffffffffffffff60,
                              (CVmNativeCodeDesc *)in_stack_ffffffffffffff58);
  if (iVar2 == 0) {
    CVmRun::pop_prop(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    local_5a = (undefined2)local_48;
    CVmRun::pop_obj(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    iVar2 = local_48;
    CVmRun::pop_obj(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    iVar1 = local_48;
    if (local_3c < 4) {
      local_54 = 1;
    }
    else {
      CVmRun::pop_int(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      local_54 = local_48;
    }
    local_60 = 0;
    local_58 = (**(code **)(*in_RDI + 0x78))
                         (in_RDI,local_5a,local_50,local_14,iVar2,iVar1,&local_60,0);
    if (local_54 == 1) {
      vm_val_t::set_logical(local_20,local_58);
    }
    else {
      if (local_54 != 4) {
        err_throw(0);
      }
      if (local_58 == 0) {
        vm_val_t::set_nil(local_20);
      }
      else {
        if (local_60 != 0) {
          local_14 = local_60;
        }
        vm_val_t::set_obj(local_20,local_14);
      }
    }
  }
  return 1;
}

Assistant:

int CVmObject::getp_propinh(VMG_ vm_obj_id_t self,
                            vm_val_t *retval, uint *in_argc,
                            vm_prop_id_t, vm_obj_id_t *)
{
    uint argc = (in_argc != 0 ? *in_argc : 0);
    vm_val_t val;
    int flags;
    int found;
    vm_prop_id_t prop;
    vm_obj_id_t source_obj;
    vm_obj_id_t orig_target_obj;
    vm_obj_id_t defining_obj;
    static CVmNativeCodeDesc desc(3, 1);

    /* check arguments */
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* pop the property address to test */
    G_interpreter->pop_prop(vmg_ &val);
    prop = val.val.prop;

    /* get the original target object */
    G_interpreter->pop_obj(vmg_ &val);
    orig_target_obj = val.val.obj;

    /* get the defining object */
    G_interpreter->pop_obj(vmg_ &val);
    defining_obj = val.val.obj;

    /* if we have the flag argument, get it; otherwise, use the default */
    if (argc >= 4)
    {
        /* get the flag value */
        G_interpreter->pop_int(vmg_ &val);
        flags = (int)val.val.intval;
    }
    else
    {
        /* use the default flags */
        flags = VMOBJ_PROPDEF_ANY;
    }

    /* presume we won't find a valid source object */
    source_obj = VM_INVALID_OBJ;

    /* look up the property */
    found = inh_prop(vmg_ prop, &val, self, orig_target_obj, defining_obj,
                     &source_obj, 0);

    /* check the flags */
    switch(flags)
    {
    case VMOBJ_PROPDEF_ANY:
        /* return true if the property is defined */
        retval->set_logical(found);
        break;

    case VMOBJ_PROPDEF_GET_CLASS:
        /* return the defining class, or nil if it's not defined */
        if (found)
        {
            /* return the source object, or 'self' if we didn't find one */
            retval->set_obj(source_obj != VM_INVALID_OBJ ? source_obj : self);
        }
        else
        {
            /* didn't find it - the return value is nil */
            retval->set_nil();
        }
        break;

    default:
        /* other flags are invalid */
        err_throw(VMERR_BAD_VAL_BIF);
        break;
    }

    /* handled */
    return TRUE;
}